

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O3

Opnd * __thiscall IRBuilder::GetEnvironmentOperand(IRBuilder *this,uint32 offset)

{
  code *pcVar1;
  bool bVar2;
  RegSlot reg;
  RegSlot RVar3;
  SymOpnd *src1Opnd;
  RegOpnd *pRVar4;
  Instr *pIVar5;
  undefined4 *puVar6;
  JITTimeFunctionBody *pJVar7;
  StackSym *pSVar8;
  Func *func;
  
  if ((this->m_func->stackClosure == true) &&
     (pSVar8 = this->m_func->m_localFrameDisplaySym, pSVar8 != (StackSym *)0x0)) {
    src1Opnd = BuildFieldOpnd(this,LdSlotArr,(pSVar8->super_Sym).m_id,0,0xffffffff,
                              PropertyKindSlotArray,0xffffffff);
    pRVar4 = IR::RegOpnd::New(TyVar,this->m_func);
    pIVar5 = IR::Instr::New(LdSlotArr,&pRVar4->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
    AddInstr(this,pIVar5,offset);
    pSVar8 = pRVar4->m_sym;
  }
  else {
    reg = GetEnvRegForInnerFrameDisplay(this);
    if (reg == 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0xf65,"(symID != Js::Constants::NoRegister)",
                         "symID != Js::Constants::NoRegister");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar6 = 0;
    }
    bVar2 = JITTimeWorkItem::IsLoopBody(this->m_func->m_workItem);
    if (bVar2) {
      pJVar7 = JITTimeWorkItem::GetJITFunctionBody(this->m_func->m_workItem);
      bVar2 = JITTimeFunctionBody::RegIsConstant(pJVar7,reg);
      if (!bVar2) {
        EnsureLoopBodyLoadSlot(this,reg,false);
      }
    }
    func = this->m_func;
    if (func->stackNestedFunc == true) {
      pJVar7 = JITTimeWorkItem::GetJITFunctionBody(func->m_workItem);
      RVar3 = JITTimeFunctionBody::GetEnvReg(pJVar7);
      func = this->m_func;
      if (reg == RVar3) {
        pRVar4 = IR::RegOpnd::New(TyVar,func);
        pIVar5 = IR::Instr::New(LdEnv,&pRVar4->super_Opnd,this->m_func);
        AddInstr(this,pIVar5,offset);
        pSVar8 = pRVar4->m_sym;
        goto LAB_004cb6b4;
      }
    }
    pSVar8 = StackSym::FindOrCreate(reg,reg,func,TyVar);
  }
LAB_004cb6b4:
  pRVar4 = IR::RegOpnd::New(pSVar8,TyVar,this->m_func);
  return &pRVar4->super_Opnd;
}

Assistant:

IR::Opnd*
IRBuilder::GetEnvironmentOperand(uint32 offset)
{
    StackSym* sym = nullptr;
    // The byte code doesn't refer directly to a closure environment. Get the implicit one
    // that's pointed to by the function body.
    if (m_func->DoStackFrameDisplay() && m_func->GetLocalFrameDisplaySym())
    {
        // Read the scope slot pointer back using the stack closure sym.
        IR::Opnd *fieldOpnd = this->BuildFieldOpnd(Js::OpCode::LdSlotArr, m_func->GetLocalFrameDisplaySym()->m_id, 0, (Js::PropertyIdIndexType) - 1, PropertyKindSlotArray);
        IR::RegOpnd *regOpnd = IR::RegOpnd::New(TyVar, m_func);
        this->AddInstr(
            IR::Instr::New(Js::OpCode::LdSlotArr, regOpnd, fieldOpnd, m_func),
            offset);
        sym = regOpnd->m_sym;
    }
    else
    {
        SymID symID;
        symID = this->GetEnvRegForInnerFrameDisplay();
        Assert(symID != Js::Constants::NoRegister);
        if (IsLoopBody() && !RegIsConstant(symID))
        {
            this->EnsureLoopBodyLoadSlot(symID);
        }

        if (m_func->DoStackNestedFunc() && symID == GetEnvReg())
        {
            // Environment is not guaranteed constant during this function because it could become boxed during execution,
            // so load the environment every time you need it.
            IR::RegOpnd *regOpnd = IR::RegOpnd::New(TyVar, m_func);
            this->AddInstr(
                IR::Instr::New(Js::OpCode::LdEnv, regOpnd, m_func),
                offset);
            sym = regOpnd->m_sym;
        }
        else
        {
            sym = StackSym::FindOrCreate(symID, (Js::RegSlot)symID, m_func);
        }
    }

    return IR::RegOpnd::New(sym, TyVar, m_func);
}